

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-player.c
# Opt level: O2

wchar_t project_player_handler_DARK(project_player_handler_context_t *context)

{
  wchar_t amount;
  player *p;
  _Bool _Var1;
  uint32_t uVar2;
  long lVar3;
  player_state_conflict *ppVar4;
  undefined1 *puVar5;
  player_state_conflict in_stack_fffffffffffffe98;
  
  ppVar4 = &player->state;
  puVar5 = &stack0xfffffffffffffe98;
  for (lVar3 = 0x13c; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = (char)ppVar4->stat_add[0];
    ppVar4 = (player_state_conflict *)((long)ppVar4->stat_add + 1);
    puVar5 = puVar5 + 1;
  }
  _Var1 = player_resists_effects(in_stack_fffffffffffffe98,L'\x06');
  p = player;
  if (_Var1) {
    msg("You resist the effect!");
  }
  else {
    uVar2 = Rand_div(5);
    player_inc_timed(p,L'\x02',uVar2 + L'\x03',true,true,true);
    if (L'E' < context->power) {
      uVar2 = Rand_div(context->dam);
      if (100 < (int)uVar2) {
        _Var1 = player_of_has(player,L'\x10');
        if (_Var1) {
          equip_learn_flag(player,L'\x10');
        }
        else {
          amount = context->dam;
          msg("The darkness steals your life force!");
          player_exp_lose(player,amount,false);
        }
      }
      uVar2 = Rand_div(context->dam);
      if (200 < (int)uVar2) {
        msg("You feel unsure of yourself in the darkness.");
        player_inc_timed(player,L'\x01',context->dam / 100,true,true,false);
      }
      uVar2 = Rand_div(context->dam);
      if (300 < (int)uVar2) {
        msg("Darkness penetrates your mind!");
        player_inc_timed(player,L'\x19',context->dam / 100,true,true,false);
      }
    }
  }
  return L'\0';
}

Assistant:

static int project_player_handler_DARK(project_player_handler_context_t *context)
{
	if (player_resists_effects(player->state, ELEM_DARK)) {
		msg("You resist the effect!");
		return 0;
	}

	(void)player_inc_timed(player, TMD_BLIND, 2 + randint1(5), true, true,
		true);

	/* Unresisted dark from powerful monsters is bad news */
	if (context->power >= 70) {
		/* Life draining */
		if (randint0(context->dam) > 100) {
			if (player_of_has(player, OF_HOLD_LIFE)) {
				equip_learn_flag(player, OF_HOLD_LIFE);
			} else {
				int drain = context->dam;
				msg("The darkness steals your life force!");
				player_exp_lose(player, drain, false);
			}
		}

		/* Slowing */
		if (randint0(context->dam) > 200) {
			msg("You feel unsure of yourself in the darkness.");
			(void)player_inc_timed(player, TMD_SLOW,
				context->dam / 100, true, true, false);
		}

		/* Amnesia */
		if (randint0(context->dam) > 300) {
			msg("Darkness penetrates your mind!");
			(void)player_inc_timed(player, TMD_AMNESIA,
				context->dam / 100, true, true, false);
		}
	}
	return 0;
}